

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall csguide_webserver::HttpServer::Run(HttpServer *this,int max_queue_size)

{
  int fd;
  pointer psVar1;
  int epoll_fd;
  HttpData *__p;
  __shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2> *__r;
  vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
  events;
  __shared_ptr<void,(__gnu_cxx::_Lock_policy)2> local_138 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2> local_128;
  shared_ptr<csguide_webserver::HttpData> httpData;
  _Bind<void_(csguide_webserver::HttpServer::*(csguide_webserver::HttpServer_*,_std::_Placeholder<1>))(std::shared_ptr<void>)>
  local_108;
  function<void_(std::shared_ptr<void>)> local_f0;
  ThreadPool threadPool;
  
  ThreadPool::ThreadPool(&threadPool,this->server_conf_->thread_num,max_queue_size);
  epoll_fd = Epoll::Init(0x400);
  __p = (HttpData *)operator_new(0x58);
  (__p->client_socket_).
  super___shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->client_socket_).
  super___shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->response_).super___shared_ptr<csguide_webserver::HttpResponse,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__p->response_).super___shared_ptr<csguide_webserver::HttpResponse,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->request_).super___shared_ptr<csguide_webserver::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__p->request_).super___shared_ptr<csguide_webserver::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->super_enable_shared_from_this<csguide_webserver::HttpData>)._M_weak_this.
  super___weak_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->super_enable_shared_from_this<csguide_webserver::HttpData>)._M_weak_this.
  super___weak_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p->epoll_fd = -1;
  (__p->timer_).super___weak_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->timer_).super___weak_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<csguide_webserver::HttpData,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<csguide_webserver::HttpData,void>
            ((__shared_ptr<csguide_webserver::HttpData,(__gnu_cxx::_Lock_policy)2> *)&httpData,__p);
  (httpData.super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  epoll_fd = epoll_fd;
  (this->serverSocket).epoll_fd_ = epoll_fd;
  fd = (this->serverSocket).listen_fd_;
  std::__shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_128,
             &httpData.super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>);
  Epoll::Addfd(epoll_fd,fd,0x80000001,(shared_ptr<csguide_webserver::HttpData> *)&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
  do {
    Epoll::Poll(&events,&this->serverSocket,0x400,-1);
    psVar1 = events.
             super__Vector_base<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__r = &(events.
                 super__Vector_base<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>;
        __r != &psVar1->super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>;
        __r = __r + 1) {
      std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<csguide_webserver::HttpData,void>(local_138,__r);
      local_108._M_f = (offset_in_HttpServer_to_subr)DoRequest;
      local_108._8_8_ = 0;
      local_108._M_bound_args.
      super__Tuple_impl<0UL,_csguide_webserver::HttpServer_*,_std::_Placeholder<1>_>.
      super__Head_base<0UL,_csguide_webserver::HttpServer_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_csguide_webserver::HttpServer_*,_std::_Placeholder<1>_>)
           (_Tuple_impl<0UL,_csguide_webserver::HttpServer_*,_std::_Placeholder<1>_>)this;
      std::function<void(std::shared_ptr<void>)>::
      function<std::_Bind<void(csguide_webserver::HttpServer::*(csguide_webserver::HttpServer*,std::_Placeholder<1>))(std::shared_ptr<void>)>,void>
                ((function<void(std::shared_ptr<void>)> *)&local_f0,&local_108);
      ThreadPool::Append(&threadPool,(shared_ptr<void> *)local_138,&local_f0);
      std::_Function_base::~_Function_base(&local_f0.super__Function_base);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130);
    }
    TimerManager::handle_expired_event((TimerManager *)Epoll::timer_manager_);
    std::
    vector<std::shared_ptr<csguide_webserver::HttpData>,_std::allocator<std::shared_ptr<csguide_webserver::HttpData>_>_>
    ::~vector(&events);
  } while( true );
}

Assistant:

void HttpServer::Run(int max_queue_size) {
  ThreadPool threadPool(server_conf_.thread_num, max_queue_size);
  int epoll_fd = Epoll::Init(1024);
  std::shared_ptr<HttpData> httpData(new HttpData());
  httpData->epoll_fd = epoll_fd;
  serverSocket.epoll_fd_ = epoll_fd;  // 之前就是这里忘了添加,导致穿进去的serverSocket具有不正确的epoll_fd

  __uint32_t event = (EPOLLIN | EPOLLET);
    Epoll::Addfd(epoll_fd, serverSocket.listen_fd_, event, httpData);

  while (true) {
    std::vector<std::shared_ptr<HttpData>> events = Epoll::Poll(serverSocket, 1024, -1);
    // FIXME 将事件传递给 线程池
    for (auto& req : events) {
        threadPool.Append(req, std::bind(&HttpServer::DoRequest, this, std::placeholders::_1));
    }
    // 处理定时器超时事件
    Epoll::timer_manager_.handle_expired_event();
  }
}